

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestConfigureCommand::Clone(cmCTestConfigureCommand *this)

{
  cmCTestScriptHandler *pcVar1;
  cmCTestHandlerCommand *this_00;
  
  this_00 = (cmCTestHandlerCommand *)operator_new(0xa8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(this_00);
  (this_00->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_0069af58;
  (this_00->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[7] = "OPTIONS";
  (this_00->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[8] = (char *)0x0;
  this_00->Last = 8;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  (this_00->super_cmCTestCommand).CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestCommand).CTestScriptHandler = pcVar1;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestConfigureCommand* ni = new cmCTestConfigureCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }